

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<long_double>_>::PutVal
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t r,int64_t c,
          complex<long_double> *value)

{
  complex<long_double> a;
  bool bVar1;
  long lVar2;
  int64_t iVar3;
  ostream *this_00;
  complex<long_double> **ppcVar4;
  undefined8 *in_RCX;
  complex<long_double> *pcVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t index;
  int64_t col;
  int64_t row;
  char *in_stack_00000148;
  char *in_stack_00000150;
  int64_t in_stack_ffffffffffffff58;
  TPZSkylMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff60;
  long local_38;
  long local_30;
  undefined8 *local_28;
  
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RCX;
  if (in_RDX < in_RSI) {
    TPZMatrix<std::complex<long_double>_>::Swap(&local_30,&local_38);
  }
  lVar2 = local_38 - local_30;
  iVar3 = Size(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (iVar3 <= lVar2) {
    in_stack_ffffffffffffff58 = local_28[2];
    in_stack_ffffffffffffff60 = (TPZSkylMatrix<std::complex<long_double>_> *)local_28[3];
    a._M_value._8_8_ = *local_28;
    a._M_value._0_8_ = in_RDI;
    a._M_value._16_8_ = local_28[1];
    a._M_value._24_8_ = in_stack_ffffffffffffff58;
    bVar1 = IsZero(a);
    if (!bVar1) {
      this_00 = std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size");
      iVar3 = Size(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::ostream::operator<<(this_00,iVar3);
      std::ostream::flush();
      TPZMatrix<std::complex<long_double>_>::Error(in_stack_00000150,in_stack_00000148);
      goto LAB_01388328;
    }
  }
  iVar3 = Size(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (iVar3 <= lVar2) {
    return 1;
  }
LAB_01388328:
  ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[]
                      ((TPZVec<std::complex<long_double>_*> *)(in_RDI + 0x20),local_38);
  pcVar5 = *ppcVar4 + lVar2;
  *(undefined8 *)pcVar5->_M_value = *local_28;
  *(undefined8 *)(pcVar5->_M_value + 8) = local_28[1];
  *(undefined8 *)(pcVar5->_M_value + 0x10) = local_28[2];
  *(undefined8 *)(pcVar5->_M_value + 0x18) = local_28[3];
  *(undefined1 *)(in_RDI + 0x18) = 0;
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}